

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_consume(nghttp2_session *session,int32_t stream_id,size_t size)

{
  int iVar1;
  nghttp2_stream *delta_size;
  nghttp2_session *in_RDX;
  int in_ESI;
  long in_RDI;
  nghttp2_stream *stream;
  int rv;
  size_t in_stack_ffffffffffffffc8;
  nghttp2_session *in_stack_ffffffffffffffd0;
  int32_t stream_id_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_ESI == 0) {
    local_4 = -0x1f5;
  }
  else if ((*(uint *)(in_RDI + 0xb64) & 1) == 0) {
    local_4 = -0x207;
  }
  else {
    local_4 = session_update_connection_consumed_size
                        (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    stream_id_00 = (int32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
    iVar1 = nghttp2_is_fatal(local_4);
    if (iVar1 == 0) {
      delta_size = nghttp2_session_get_stream
                             ((nghttp2_session *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                              stream_id_00);
      if (delta_size == (nghttp2_stream *)0x0) {
        local_4 = 0;
      }
      else {
        local_4 = session_update_stream_consumed_size
                            (in_RDX,(nghttp2_stream *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                             (size_t)delta_size);
        iVar1 = nghttp2_is_fatal(local_4);
        if (iVar1 == 0) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int nghttp2_session_consume(nghttp2_session *session, int32_t stream_id,
                            size_t size) {
  int rv;
  nghttp2_stream *stream;

  if (stream_id == 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE)) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  rv = session_update_connection_consumed_size(session, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  stream = nghttp2_session_get_stream(session, stream_id);

  if (!stream) {
    return 0;
  }

  rv = session_update_stream_consumed_size(session, stream, size);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return 0;
}